

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O1

int lws_parse_numeric_address(char *ads,uint8_t *result,size_t max_len)

{
  char cVar1;
  uint8_t *puVar2;
  size_t sVar3;
  lws_tokenize_elem lVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  int iVar9;
  int iVar10;
  uint8_t *__s;
  int iVar11;
  uint uVar12;
  bool bVar13;
  char t [5];
  lws_tokenize ts;
  uint8_t temp [16];
  int local_9c;
  char local_95 [5];
  ulong local_90;
  uint8_t *local_88;
  lws_tokenize local_80;
  uint8_t *local_58;
  long local_50;
  undefined1 local_48 [24];
  
  local_88 = result;
  pcVar5 = strchr(ads,0x3a);
  bVar13 = pcVar5 != (char *)0x0;
  lws_tokenize_init(&local_80,ads,0x41);
  local_80.len = strlen(ads);
  puVar8 = local_88;
  iVar10 = -1;
  if ((((6 < local_80.len || bVar13) && (iVar10 = -2, pcVar5 == (char *)0x0 || 1 < local_80.len)) &&
      (iVar10 = -3, 3 < max_len || pcVar5 != (char *)0x0)) &&
     (iVar10 = -4, 0xf < max_len || pcVar5 == (char *)0x0)) {
    if (pcVar5 != (char *)0x0) {
      memset(local_88,0,max_len);
    }
    local_58 = puVar8 + 0xc;
    local_50 = (long)(int)max_len;
    local_9c = -1;
    local_90 = 0;
    __s = puVar8;
    iVar10 = 0;
    do {
      lVar4 = lws_tokenize(&local_80);
      sVar3 = local_80.token_len;
      puVar2 = local_88;
      local_80.e = (int8_t)lVar4;
      iVar11 = (int)__s;
      if (local_80.e == '\x01') {
        iVar9 = iVar10 + 1;
        if (iVar10 == 0) {
          if (bVar13) {
            if (((__s[2] == 0xff) && (__s[3] == 0xff)) && (local_9c == 2)) {
              local_90 = 0;
              memset(__s,0,max_len);
              __s[10] = 0xff;
              __s[0xb] = 0xff;
              local_9c = -1;
              bVar13 = false;
              puVar8 = local_58;
            }
            else {
              bVar13 = true;
              if (*local_80.token != ':') {
                return -10;
              }
            }
          }
          else {
            bVar13 = false;
            if (*local_80.token != '.') {
              return -0xb;
            }
          }
        }
        else {
          if (1 < iVar10) {
            return -8;
          }
          if (*local_80.token != ':') {
            return -9;
          }
          puVar8[0] = '\0';
          puVar8[1] = '\0';
          local_9c = (int)(puVar8 + 2) - iVar11;
          puVar8 = puVar8 + 2;
        }
      }
      else {
        if (local_80.e != '\x02') {
          if (local_80.e != '\0') {
            _lws_log(1,"%s: malformed ip address\n","lws_parse_numeric_address");
            return -0xd;
          }
          if (((int)local_90 == 4 && !bVar13) || ((int)local_90 == 8 && bVar13)) {
            return (int)puVar8 - iVar11;
          }
          if (local_9c == -1) {
            return -0xc;
          }
          iVar11 = (int)puVar8 - iVar11;
          if (iVar11 == 0x10) {
            return 0x10;
          }
          puVar8 = local_88 + local_9c;
          uVar12 = iVar11 - local_9c;
          memcpy(local_48,puVar8,(ulong)uVar12);
          memset(puVar8,0,(ulong)(0x10 - local_9c));
          memcpy(puVar2 + (int)(0x10 - uVar12),local_48,(ulong)uVar12);
          return 0x10;
        }
        if (bVar13) {
          if (4 < local_80.token_len) {
            return -1;
          }
          memcpy(local_95,local_80.token,local_80.token_len);
          local_95[sVar3] = '\0';
          if (sVar3 != 0) {
            uVar6 = 0;
            do {
              cVar1 = local_95[uVar6];
              if ((byte)(cVar1 + 0x99U) < 0xc9) {
                return -1;
              }
              if ((byte)(cVar1 - 0x3aU) < 7) {
                return -1;
              }
              if ((byte)(cVar1 + 0xb9U) < 0x1a) {
                return -1;
              }
              uVar6 = uVar6 + 1;
            } while (sVar3 != uVar6);
          }
          lVar7 = strtol(local_95,(char **)0x0,0x10);
          if (0xffff < lVar7) {
            return -5;
          }
          *puVar8 = (uint8_t)((ulong)lVar7 >> 8);
          puVar8 = puVar8 + 1;
        }
        else {
          if (3 < local_80.token_len) {
            return -1;
          }
          memcpy(local_95,local_80.token,local_80.token_len);
          local_95[sVar3] = '\0';
          if (sVar3 != 0) {
            uVar6 = 0;
            do {
              if ((byte)(local_95[uVar6] - 0x3aU) < 0xf6) {
                return -1;
              }
              uVar6 = uVar6 + 1;
            } while (sVar3 != uVar6);
          }
          lVar7 = strtol(local_95,(char **)0x0,10);
          if (0xff < lVar7) {
            return -6;
          }
        }
        if (lVar7 < 0) {
          return -7;
        }
        *puVar8 = (uint8_t)lVar7;
        local_90 = (ulong)((int)local_90 + 1);
        iVar9 = 0;
        puVar8 = puVar8 + 1;
        __s = local_88;
      }
    } while (('\0' < local_80.e) && (iVar10 = iVar9, (long)puVar8 - (long)__s <= local_50));
    _lws_log(1,"%s: ended on e %d\n","lws_parse_numeric_address");
    iVar10 = -0xe;
  }
  return iVar10;
}

Assistant:

int
lws_parse_numeric_address(const char *ads, uint8_t *result, size_t max_len)
{
	struct lws_tokenize ts;
	uint8_t *orig = result, temp[16];
	int sects = 0, ipv6 = !!strchr(ads, ':'), skip_point = -1, dm = 0;
	char t[5];
	size_t n;
	long u;

	lws_tokenize_init(&ts, ads, LWS_TOKENIZE_F_NO_INTEGERS |
				    LWS_TOKENIZE_F_MINUS_NONTERM);
	ts.len = strlen(ads);
	if (!ipv6 && ts.len < 7)
		return -1;

	if (ipv6 && ts.len < 2)
		return -2;

	if (!ipv6 && max_len < 4)
		return -3;

	if (ipv6 && max_len < 16)
		return -4;

	if (ipv6)
		memset(result, 0, max_len);

	do {
		ts.e = (int8_t)lws_tokenize(&ts);
		switch (ts.e) {
		case LWS_TOKZE_TOKEN:
			dm = 0;
			if (ipv6) {
				if (ts.token_len > 4)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > 'f' ||
					    (t[n] > '9' && t[n] < 'A') ||
					    (t[n] > 'F' && t[n] < 'a'))
						return -1;
				u = strtol(t, NULL, 16);
				if (u > 0xffff)
					return -5;
				*result++ = (uint8_t)(u >> 8);
			} else {
				if (ts.token_len > 3)
					return -1;
				memcpy(t, ts.token, ts.token_len);
				t[ts.token_len] = '\0';
				for (n = 0; n < ts.token_len; n++)
					if (t[n] < '0' || t[n] > '9')
						return -1;
				u = strtol(t, NULL, 10);
				if (u > 0xff)
					return -6;
			}
			if (u < 0)
				return -7;
			*result++ = (uint8_t)u;
			sects++;
			break;

		case LWS_TOKZE_DELIMITER:
			if (dm++) {
				if (dm > 2)
					return -8;
				if (*ts.token != ':')
					return -9;
				/* back to back : */
				*result++ = 0;
				*result++ = 0;
				skip_point = lws_ptr_diff(result, orig);
				break;
			}
			if (ipv6 && orig[2] == 0xff && orig[3] == 0xff &&
			    skip_point == 2) {
				/* ipv4 backwards compatible format */
				ipv6 = 0;
				memset(orig, 0, max_len);
				orig[10] = 0xff;
				orig[11] = 0xff;
				skip_point = -1;
				result = &orig[12];
				sects = 0;
				break;
			}
			if (ipv6 && *ts.token != ':')
				return -10;
			if (!ipv6 && *ts.token != '.')
				return -11;
			break;

		case LWS_TOKZE_ENDED:
			if (!ipv6 && sects == 4)
				return lws_ptr_diff(result, orig);
			if (ipv6 && sects == 8)
				return lws_ptr_diff(result, orig);
			if (skip_point != -1) {
				int ow = lws_ptr_diff(result, orig);
				/*
				 * contains ...::...
				 */
				if (ow == 16)
					return 16;
				memcpy(temp, &orig[skip_point], (unsigned int)(ow - skip_point));
				memset(&orig[skip_point], 0, (unsigned int)(16 - skip_point));
				memcpy(&orig[16 - (ow - skip_point)], temp,
						   (unsigned int)(ow - skip_point));

				return 16;
			}
			return -12;

		default: /* includes ENDED */
			lwsl_err("%s: malformed ip address\n",
				 __func__);

			return -13;
		}
	} while (ts.e > 0 && result - orig <= (int)max_len);

	lwsl_err("%s: ended on e %d\n", __func__, ts.e);

	return -14;
}